

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

void __thiscall
timertt::details::
thread_impl_template<timertt::details::timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::sleep_for_next_event
          (thread_impl_template<timertt::details::timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
           *this,lock_guard *lock)

{
  bool bVar1;
  unique_lock<std::mutex> *__lock;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point time_point;
  lock_guard *lock_local;
  thread_impl_template<timertt::details::timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
  *this_local;
  
  if ((this->m_shutdown & 1U) == 0) {
    time_point.__d.__r = (duration)(duration)lock;
    bVar1 = timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
            ::empty(&(this->
                     super_basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
                     ).m_engine);
    if (bVar1) {
      thread_mixin::lock_guard::actual_lock((lock_guard *)time_point.__d.__r);
      std::condition_variable::wait
                ((unique_lock *)
                 &(this->
                  super_basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
                  ).super_type.m_condition);
    }
    else {
      local_20.__d.__r =
           (duration)
           timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
           ::nearest_time_point
                     (&(this->
                       super_basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
                       ).m_engine);
      __lock = thread_mixin::lock_guard::actual_lock((lock_guard *)time_point.__d.__r);
      std::condition_variable::wait_until<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                (&(this->
                  super_basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
                  ).super_type.m_condition,__lock,&local_20);
    }
  }
  return;
}

Assistant:

void
	sleep_for_next_event(
		//! Object's lock.
		//! The lock is necessary for waiting on condition variable.
		typename base_type::lock_guard & lock )
	{
		if( !this->m_shutdown )
		{
			if( !this->m_engine.empty() )
			{
				auto time_point = this->m_engine.nearest_time_point();
				this->m_condition.wait_until( lock.actual_lock(), time_point );
			}
			else
				this->m_condition.wait( lock.actual_lock() );
		}
	}